

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O2

int __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>_>
::access(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>_>
         *this,char *__name,int __type)

{
  uint uVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  byte bVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  
  uVar6 = (uint)__name;
  if ((ushort)((short)__name + 0x3d00U) < 0xd00) {
    bVar3 = 0;
    if ((uVar6 & 0xcf00) == 0xc300) {
      bVar3 = (this->switches_).slot_C3_rom ^ 1;
    }
    (this->switches_).internal_C8_rom =
         (short)__name != -0x3001 && ((this->switches_).internal_C8_rom != false || bVar3 != 0);
    set_card_paging(this);
    return extraout_EAX;
  }
  uVar2 = uVar6 + 0x3fa8;
  if (0xffa7 < (ushort)uVar2) {
    uVar1 = uVar6 & 0xffff;
    bVar5 = SUB81(__name,0);
    uVar2 = 0x44a204;
    cVar4 = (char)__type;
    switch(uVar1) {
    case 0xc000:
    case 0xc001:
      if (cVar4 == '\0') {
        (this->switches_).store_80 = bVar5;
        set_main_paging(this);
        return extraout_EAX_00;
      }
      break;
    case 0xc002:
    case 0xc003:
      if (cVar4 == '\0') {
        (this->switches_).read_auxiliary_memory = (bool)(bVar5 & 1);
        set_main_paging(this);
        return extraout_EAX_06;
      }
      break;
    case 0xc004:
    case 0xc005:
      if (cVar4 == '\0') {
        (this->switches_).write_auxiliary_memory = (bool)(bVar5 & 1);
        set_main_paging(this);
        return extraout_EAX_03;
      }
      break;
    case 0xc006:
    case 0xc007:
      if (cVar4 == '\0') {
        (this->switches_).internal_CX_rom = (bool)(bVar5 & 1);
        set_card_paging(this);
        return extraout_EAX_04;
      }
      break;
    case 0xc008:
    case 0xc009:
      if (cVar4 == '\0') {
        bVar5 = (this->switches_).alternative_zero_page;
        uVar2 = (uint)bVar5;
        if ((uVar6 & 1) != (uint)bVar5) {
          (this->switches_).alternative_zero_page = SUB41(uVar6 & 1,0);
          set_zero_page_paging(this);
          return extraout_EAX_02;
        }
      }
      break;
    case 0xc00a:
    case 0xc00b:
      if (cVar4 == '\0') {
        (this->switches_).slot_C3_rom = (bool)(bVar5 & 1);
        set_card_paging(this);
        return extraout_EAX_07;
      }
      break;
    default:
      if (uVar1 - 0xc054 < 2) {
        (this->switches_).video_page_2 = (bool)(bVar5 & 1);
        set_main_paging(this);
        return extraout_EAX_05;
      }
      uVar2 = uVar1 - 0xc056;
      if (uVar2 < 2) {
        (this->switches_).high_resolution = (bool)(bVar5 & 1);
        set_main_paging(this);
        return extraout_EAX_01;
      }
    }
  }
  return uVar2;
}

Assistant:

void access(uint16_t address, bool is_read) {
			if(address >= 0xc300 && address < 0xd000) {
				switches_.internal_C8_rom |= ((address >> 8) == 0xc3) && !switches_.slot_C3_rom;
				switches_.internal_C8_rom &= (address != 0xcfff);
				set_card_paging();
				return;
			}

			if(address < 0xc000 || address >= 0xc058) return;

			switch(address) {
				default: break;

				case 0xc000: case 0xc001:
					if(!is_read) {
						switches_.store_80 = address & 1;
						set_main_paging();
					}
				break;

				case 0xc002: case 0xc003:
					if(!is_read) {
						switches_.read_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc004: case 0xc005:
					if(!is_read) {
						switches_.write_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc006: case 0xc007:
					if(!is_read) {
						switches_.internal_CX_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc008: case 0xc009: {
					const bool alternative_zero_page = address & 1;
					if(!is_read && switches_.alternative_zero_page != alternative_zero_page) {
						switches_.alternative_zero_page = alternative_zero_page;
						set_zero_page_paging();
					}
				} break;

				case 0xc00a: case 0xc00b:
					if(!is_read) {
						switches_.slot_C3_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc054: case 0xc055:
					switches_.video_page_2 = address & 1;
					set_main_paging();
				break;

				case 0xc056: case 0xc057:
					switches_.high_resolution = address & 1;
					set_main_paging();
				break;
			}
		}